

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_filters.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  uint8_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  ostream *this;
  long in_RSI;
  int in_EDI;
  exception *ex;
  Image filtered;
  Image image;
  string filePath;
  string *in_stack_000002d8;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffe18;
  undefined6 in_stack_fffffffffffffe20;
  uint8_t in_stack_fffffffffffffe26;
  uint8_t in_stack_fffffffffffffe27;
  uint32_t in_stack_fffffffffffffe28;
  uint32_t in_stack_fffffffffffffe2c;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffe30;
  allocator *path;
  Image *in_stack_fffffffffffffe38;
  Image *out;
  undefined8 in_stack_fffffffffffffe40;
  uint32_t kernelSize;
  Image *in;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 uVar6;
  allocator local_179;
  string local_178 [39];
  undefined1 local_151 [40];
  undefined1 local_129 [119];
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [64];
  ImageTemplate<unsigned_char> local_70;
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_8;
  undefined4 local_4;
  
  kernelSize = (uint32_t)((ulong)in_stack_fffffffffffffe40 >> 0x20);
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"lena.bmp",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (1 < local_8) {
    std::__cxx11::string::operator=(local_30,*(char **)(local_10 + 8));
  }
  Bitmap_Operation::Load(in_stack_000002d8);
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(&local_70);
  if (!bVar1) {
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(&local_70);
    uVar6 = CONCAT13(uVar2,(int3)in_stack_fffffffffffffe54);
    if (uVar2 != '\x01') {
      Image_Function::ConvertToGrayScale(in_stack_fffffffffffffe18);
      PenguinV_Image::ImageTemplate<unsigned_char>::operator=
                ((ImageTemplate<unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffffe27,
                          CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)),
                 in_stack_fffffffffffffe18);
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
                ((ImageTemplate<unsigned_char> *)0x1037c9);
    }
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_70);
    uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_70);
    PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,
               in_stack_fffffffffffffe27,in_stack_fffffffffffffe26);
    Image_Function::Median
              ((Image *)CONCAT44(uVar6,uVar3),(Image *)CONCAT44(uVar4,in_stack_fffffffffffffe48),
               kernelSize);
    in = (Image *)local_129;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_129 + 1),"median.bmp",(allocator *)in);
    Bitmap_Operation::Save
              ((string *)in_stack_fffffffffffffe30,
               (Image *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    std::__cxx11::string::~string((string *)(local_129 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_129);
    Image_Function::Prewitt(in,in_stack_fffffffffffffe38);
    out = (Image *)local_151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_151 + 1),"prewitt.bmp",(allocator *)out);
    Bitmap_Operation::Save
              ((string *)in_stack_fffffffffffffe30,
               (Image *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    std::__cxx11::string::~string((string *)(local_151 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_151);
    Image_Function::Sobel(in,out);
    path = &local_179;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"sobel.bmp",path);
    Bitmap_Operation::Save
              ((string *)path,(Image *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
              );
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x103999);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1039a6);
    std::__cxx11::string::~string(local_30);
    this = std::operator<<((ostream *)&std::cout,"Application ended correctly.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    return 0;
  }
  local_b2 = 1;
  uVar5 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Cannot load ",&local_b1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe27,
                          CONCAT16(in_stack_fffffffffffffe26,in_stack_fffffffffffffe20)));
  imageException::imageException
            ((imageException *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             (string *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  local_b2 = 0;
  __cxa_throw(uVar5,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

int main( int argc, char * argv[] )
{
    // This example application is made to show how filters work and what which results they produce

    try // <---- do not forget to put your code into try.. catch block!
    {
       std::string filePath = "lena.bmp"; // default image path
        if ( argc > 1 ) // Check input data
            filePath = argv[1];

        // Load an image
        PenguinV_Image::Image image = Bitmap_Operation::Load( filePath );

        // If the image is empty it means that the image doesn't exist or the file is not readable
        if( image.empty() )
            throw imageException( std::string("Cannot load ") + filePath );

        // Convert to gray-scale image if it's not
        if( image.colorCount() != PenguinV_Image::GRAY_SCALE )
            image = Image_Function::ConvertToGrayScale( image );

        // Create Image object which will contain filtered image
        PenguinV_Image::Image filtered( image.width(), image.height() );

        // Median filtering
        Image_Function::Median( image, filtered, 3 );
        Bitmap_Operation::Save( "median.bmp", filtered );

        // Prewitt filtering
        Image_Function::Prewitt( image, filtered );
        Bitmap_Operation::Save( "prewitt.bmp", filtered );

        // Sobel filtering
        Image_Function::Sobel( image, filtered );
        Bitmap_Operation::Save( "sobel.bmp", filtered );
    }
    catch( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << ex.what() << ". Press any button to continue." << std::endl;
        std::cin.ignore();
        return 1;
    }
    catch( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Press any button to continue." << std::endl;
        std::cin.ignore();
        return 2;
    }

    std::cout << "Application ended correctly." << std::endl;
    return 0;
}